

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

BOOL Js::JavascriptOperators::SetElementIHelper
               (Var receiver,RecyclableObject *object,Var index,Var value,
               ScriptContext *scriptContext,PropertyOperationFlags flags)

{
  code *pcVar1;
  Var object_00;
  RecyclableObject *instance;
  bool bVar2;
  ImplicitCallFlags IVar3;
  PropertyId propertyId;
  ThreadContext *pTVar4;
  undefined4 *puVar5;
  bool local_a9;
  PropertyRecordUsageCache *local_a8;
  PropertyRecordUsageCache *propertyRecordUsageCache;
  RecyclableObject *cacheOwner;
  PropertyValueInfo propertyValueInfo;
  JavascriptString *propertyNameString;
  PropertyRecord *propertyRecord;
  IndexType local_40;
  uint32 indexVal;
  IndexType indexType;
  PropertyOperationFlags flags_local;
  ScriptContext *scriptContext_local;
  Var value_local;
  Var index_local;
  RecyclableObject *object_local;
  Var receiver_local;
  
  propertyRecord._4_4_ = 0;
  propertyNameString = (JavascriptString *)0x0;
  propertyValueInfo.inlineCacheIndex = 0;
  propertyValueInfo.isFunctionPIC = false;
  propertyValueInfo.allowResizingPolymorphicInlineCache = false;
  propertyValueInfo._62_2_ = 0;
  indexVal = flags;
  _indexType = scriptContext;
  scriptContext_local = (ScriptContext *)value;
  value_local = index;
  index_local = object;
  object_local = (RecyclableObject *)receiver;
  PropertyValueInfo::PropertyValueInfo((PropertyValueInfo *)&cacheOwner);
  bVar2 = GetPropertyRecordUsageCache
                    (value_local,_indexType,&local_a8,(RecyclableObject **)&propertyRecordUsageCache
                    );
  if (bVar2) {
    bVar2 = SetElementIWithCache<false>
                      (object_local,(RecyclableObject *)index_local,
                       (RecyclableObject *)propertyRecordUsageCache,scriptContext_local,local_a8,
                       _indexType,indexVal,(PropertyCacheOperationInfo *)0x0);
    return (uint)bVar2;
  }
  bVar2 = TaggedNumber::Is(object_local);
  if (bVar2) {
    bVar2 = SetElementIOnTaggedNumber
                      (object_local,(RecyclableObject *)index_local,value_local,scriptContext_local,
                       _indexType,indexVal);
    return (uint)bVar2;
  }
  bVar2 = TaggedInt::Is(value_local);
  local_a9 = false;
  if (!bVar2) {
    local_a9 = VarIs<Js::JavascriptString>(value_local);
  }
  _indexType->forinNoCache = (uint)local_a9 + _indexType->forinNoCache;
  local_40 = GetIndexType(&value_local,_indexType,(uint32 *)((long)&propertyRecord + 4),
                          (PropertyRecord **)&propertyNameString,
                          (JavascriptString **)&propertyValueInfo.inlineCacheIndex,false,true);
  pTVar4 = ScriptContext::GetThreadContext(_indexType);
  bVar2 = ThreadContext::IsDisableImplicitCall(pTVar4);
  if (bVar2) {
    pTVar4 = ScriptContext::GetThreadContext(_indexType);
    IVar3 = ThreadContext::GetImplicitCallFlags(pTVar4);
    if (IVar3 != ImplicitCall_None) {
      return 0;
    }
  }
  if (local_40 == IndexType_Number) {
LAB_00f9961e:
    receiver_local._4_4_ =
         SetItem(object_local,(RecyclableObject *)index_local,propertyRecord._4_4_,
                 scriptContext_local,_indexType,indexVal,0);
  }
  else {
    if (local_40 == IndexType_JavascriptString) {
      if (propertyValueInfo._56_8_ == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                    ,0x12c3,"(propertyNameString)","propertyNameString");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 0;
      }
      if (propertyNameString == (JavascriptString *)0x0) {
        ScriptContext::GetOrAddPropertyRecord
                  (_indexType,(JavascriptString *)propertyValueInfo._56_8_,
                   (PropertyRecord **)&propertyNameString);
        bVar2 = PropertyRecord::IsNumeric((PropertyRecord *)propertyNameString);
        if (bVar2) {
          propertyRecord._4_4_ =
               PropertyRecord::GetNumericValue((PropertyRecord *)propertyNameString);
          goto LAB_00f9961e;
        }
      }
    }
    if ((local_40 != IndexType_PropertyId) && (local_40 != IndexType_JavascriptString)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                  ,0x12d4,
                                  "(indexType == IndexType_PropertyId || indexType == IndexType_JavascriptString)"
                                  ,
                                  "indexType == IndexType_PropertyId || indexType == IndexType_JavascriptString"
                                 );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    if (propertyNameString == (JavascriptString *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                  ,0x12d5,"(propertyRecord)","propertyRecord");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    instance = object_local;
    object_00 = index_local;
    propertyId = PropertyRecord::GetPropertyId((PropertyRecord *)propertyNameString);
    receiver_local._4_4_ =
         SetProperty(instance,(RecyclableObject *)object_00,propertyId,scriptContext_local,
                     _indexType,indexVal);
  }
  return receiver_local._4_4_;
}

Assistant:

BOOL JavascriptOperators::SetElementIHelper(Var receiver, RecyclableObject* object, Var index, Var value, ScriptContext* scriptContext, PropertyOperationFlags flags)
    {
        IndexType indexType;
        uint32 indexVal = 0;
        PropertyRecord const * propertyRecord = nullptr;
        JavascriptString * propertyNameString = nullptr;
        PropertyValueInfo propertyValueInfo;

        RecyclableObject* cacheOwner;
        PropertyRecordUsageCache* propertyRecordUsageCache;
        if (JavascriptOperators::GetPropertyRecordUsageCache(index, scriptContext, &propertyRecordUsageCache, &cacheOwner))
        {
            return JavascriptOperators::SetElementIWithCache<false>(receiver, object, cacheOwner, value, propertyRecordUsageCache, scriptContext, flags, nullptr);
        }

        if (TaggedNumber::Is(receiver))
        {
            return JavascriptOperators::SetElementIOnTaggedNumber(receiver, object, index, value, scriptContext, flags);
        }

#if DBG_DUMP
        scriptContext->forinNoCache += (!TaggedInt::Is(index) && VarIs<JavascriptString>(index));
#endif
        indexType = GetIndexType(index, scriptContext, &indexVal, &propertyRecord, &propertyNameString, false, true);
        if (scriptContext->GetThreadContext()->IsDisableImplicitCall() &&
            scriptContext->GetThreadContext()->GetImplicitCallFlags() != ImplicitCall_None)
        {
            // We hit an implicit call trying to convert the index, and implicit calls are disabled, so
            // quit before we try to store the element.
            return FALSE;
        }

        if (indexType == IndexType_Number)
        {
SetElementIHelper_INDEX_TYPE_IS_NUMBER:
            return JavascriptOperators::SetItem(receiver, object, indexVal, value, scriptContext, flags);
        }
        else if (indexType == IndexType_JavascriptString)
        {
            Assert(propertyNameString);

            // At this point, we know that the propertyNameString is neither PropertyString
            // or LiteralStringWithPropertyStringPtr.. Get PropertyRecord!
            // we will get it anyways otherwise. (Also, 1:1 string comparison for Builtin types will be expensive.)

            if (propertyRecord == nullptr)
            {
                scriptContext->GetOrAddPropertyRecord(propertyNameString, &propertyRecord);
                if (propertyRecord->IsNumeric())
                {
                    indexVal = propertyRecord->GetNumericValue();
                    goto SetElementIHelper_INDEX_TYPE_IS_NUMBER;
                }
            }
        }

        Assert(indexType == IndexType_PropertyId || indexType == IndexType_JavascriptString);
        Assert(propertyRecord);
        return JavascriptOperators::SetProperty(receiver, object, propertyRecord->GetPropertyId(), value, scriptContext, flags);
    }